

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

int Abc_NodeEvalMvCost(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  int iVar1;
  char *pMvSop;
  long lVar2;
  
  for (lVar2 = 0; lVar2 <= nVars; lVar2 = lVar2 + 1) {
  }
  pMvSop = Abc_NodeConvertSopToMvSop(nVars,vSop0,vSop1);
  iVar1 = Abc_NodeEvalMvCostInternal(nVars,&vSop0->nCap,pMvSop);
  free(pMvSop);
  return iVar1;
}

Assistant:

int Abc_NodeEvalMvCost( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 ) 
{
    char * pMvSop;
    int * pVarValues;
    int i, RetValue;
    // collect the input and output values (currently, they are binary)
    pVarValues = ABC_ALLOC( int, nVars + 1 );
    for ( i = 0; i <= nVars; i++ )
        pVarValues[i] = 2;
    // prepare MV-SOP for evaluation
    pMvSop = Abc_NodeConvertSopToMvSop( nVars, vSop0, vSop1 );
    // have a look at the MV-SOP:
//    printf( "%s\n", pMvSop );
    // get the result of internal cost evaluation
    RetValue = Abc_NodeEvalMvCostInternal( nVars, pVarValues, pMvSop );
    // cleanup
    ABC_FREE( pVarValues );
    ABC_FREE( pMvSop );
    return RetValue;
}